

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall
duckdb::CSVReaderOptions::SetReadOption
          (CSVReaderOptions *this,string *loption,Value *value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *expected_names)

{
  pointer pVVar1;
  bool bVar2;
  ulong uVar3;
  unsigned_long uVar4;
  int64_t iVar5;
  InvalidInputException *pIVar6;
  vector<duckdb::Value,_true> *pvVar7;
  BinderException *pBVar8;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Value *child;
  pointer this_01;
  allocator local_119;
  string format;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = SetBaseOption(this,loption,value,false);
  if (bVar2) {
    return;
  }
  bVar2 = ::std::operator==(loption,"auto_detect");
  if (bVar2) {
    bVar2 = ParseBoolean(value,loption);
    this->auto_detect = bVar2;
    return;
  }
  bVar2 = ::std::operator==(loption,"sample_size");
  if (bVar2) {
    uVar3 = ParseInteger(value,loption);
    if (uVar3 != 0xffffffffffffffff && (long)uVar3 < 1) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&format,"Unsupported parameter for SAMPLE_SIZE: cannot be smaller than 1"
                 ,(allocator *)&local_f0);
      BinderException::BinderException(pBVar8,&format);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (uVar3 != 0xffffffffffffffff) {
      uVar4 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar3 >> 0xb);
      this->sample_size_chunks = uVar4;
      if ((uVar3 & 0x7ff) == 0) {
        return;
      }
      this->sample_size_chunks = uVar4 + 1;
      return;
    }
    this->sample_size_chunks = 0xffffffffffffffff;
    return;
  }
  bVar2 = ::std::operator==(loption,"skip");
  if (bVar2) {
    iVar5 = ParseInteger(value,loption);
    SetSkipRows(this,iVar5);
    return;
  }
  bVar2 = ::std::operator==(loption,"max_line_size");
  if ((bVar2) || (bVar2 = ::std::operator==(loption,"maximum_line_size"), bVar2)) {
    iVar5 = ParseInteger(value,loption);
    if (iVar5 < 0) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&format,
                 "Invalid value for MAX_LINE_SIZE parameter: it cannot be smaller than 0",
                 (allocator *)&local_f0);
      BinderException::BinderException(pBVar8,&format);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar4 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar5);
    if ((this->maximum_line_size).set_by_user == false) {
      (this->maximum_line_size).value = uVar4;
      (this->maximum_line_size).set_by_user = true;
    }
    if ((this->buffer_size_option).set_by_user != true) {
      return;
    }
    if ((this->maximum_line_size).value <= (this->buffer_size_option).value) {
      return;
    }
    pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&format,
               "Buffer Size of %d must be a higher value than the maximum line size %d",
               (allocator *)&local_f0);
    InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
              (pIVar6,&format,(this->buffer_size_option).value,(this->maximum_line_size).value);
    __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar2 = ::std::operator==(loption,"date_format");
  if ((bVar2) || (bVar2 = ::std::operator==(loption,"dateformat"), bVar2)) {
    ParseString(&format,value,loption);
    SetDateFormat(this,DATE,&format,true);
  }
  else {
    bVar2 = ::std::operator==(loption,"timestamp_format");
    if ((bVar2) || (bVar2 = ::std::operator==(loption,"timestampformat"), bVar2)) {
      ParseString(&format,value,loption);
      SetDateFormat(this,TIMESTAMP,&format,true);
    }
    else {
      bVar2 = ::std::operator==(loption,"ignore_errors");
      if (bVar2) {
        bVar2 = ParseBoolean(value,loption);
        if ((this->ignore_errors).set_by_user != false) {
          return;
        }
        (this->ignore_errors).value = bVar2;
        (this->ignore_errors).set_by_user = true;
        return;
      }
      bVar2 = ::std::operator==(loption,"buffer_size");
      if (bVar2) {
        iVar5 = ParseInteger(value,loption);
        uVar3 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar5);
        if ((this->buffer_size_option).set_by_user == true) {
          uVar3 = (this->buffer_size_option).value;
        }
        else {
          (this->buffer_size_option).value = uVar3;
          (this->buffer_size_option).set_by_user = true;
        }
        if (uVar3 == 0) {
          pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&format,"Buffer Size option must be higher than 0",
                     (allocator *)&local_f0);
          InvalidInputException::InvalidInputException(pIVar6,(string *)&format);
          __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->maximum_line_size).set_by_user != true) {
          (this->maximum_line_size).value = uVar3;
          (this->maximum_line_size).set_by_user = false;
          return;
        }
        if ((this->maximum_line_size).value <= uVar3) {
          return;
        }
        pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&format,
                   "Buffer Size of %d must be a higher value than the maximum line size %d",
                   (allocator *)&local_f0);
        InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                  (pIVar6,&format,(this->buffer_size_option).value,(this->maximum_line_size).value);
        __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar2 = ::std::operator==(loption,"decimal_separator");
      if (bVar2) {
        ParseString(&format,value,loption);
        __lhs = &this->decimal_separator;
        ::std::__cxx11::string::operator=((string *)__lhs,(string *)&format);
        ::std::__cxx11::string::~string((string *)&format);
        bVar2 = ::std::operator!=(__lhs,".");
        if (!bVar2) {
          return;
        }
        bVar2 = ::std::operator!=(__lhs,",");
        if (!bVar2) {
          return;
        }
        pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&format,
                   "Unsupported parameter for DECIMAL_SEPARATOR: should be \'.\' or \',\'",
                   (allocator *)&local_f0);
        BinderException::BinderException(pBVar8,&format);
        __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar2 = ::std::operator==(loption,"null_padding");
      if (bVar2) {
        bVar2 = ParseBoolean(value,loption);
        this->null_padding = bVar2;
        return;
      }
      bVar2 = ::std::operator==(loption,"parallel");
      if (bVar2) {
        bVar2 = ParseBoolean(value,loption);
        this->parallel = bVar2;
        return;
      }
      bVar2 = ::std::operator==(loption,"allow_quoted_nulls");
      if (bVar2) {
        bVar2 = ParseBoolean(value,loption);
        this->allow_quoted_nulls = bVar2;
        return;
      }
      bVar2 = ::std::operator==(loption,"store_rejects");
      if (bVar2) {
        bVar2 = ParseBoolean(value,loption);
        if ((this->store_rejects).set_by_user != false) {
          return;
        }
        (this->store_rejects).value = bVar2;
        (this->store_rejects).set_by_user = true;
        return;
      }
      bVar2 = ::std::operator==(loption,"force_not_null");
      if (bVar2) {
        if ((expected_names->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (expected_names->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ParseColumnList((vector<bool,_true> *)&format,value,expected_names,(string *)loption);
          ::std::vector<bool,_std::allocator<bool>_>::operator=
                    (&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>,
                     (vector<bool,_std::allocator<bool>_> *)&format);
          ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    ((_Bvector_base<std::allocator<bool>_> *)&format);
          return;
        }
        if (value->is_null != true) {
          pvVar7 = ListValue::GetChildren(value);
          pVVar1 = (pvVar7->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (this_01 = (pvVar7->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                         super__Vector_impl_data._M_start; this_01 != pVVar1; this_01 = this_01 + 1)
          {
            Value::GetValue<std::__cxx11::string>(&format,this_01);
            ::std::__detail::
            _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)&this->force_not_null_names,&format);
            ::std::__cxx11::string::~string((string *)&format);
          }
          return;
        }
        pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&format,"Invalid value for \'force_not_null\' paramenter",
                   (allocator *)&local_f0);
        BinderException::BinderException(pBVar8,&format);
        __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar2 = ::std::operator==(loption,"rejects_table");
      if (bVar2) {
        ParseString(&format,value,loption);
        if (format._M_string_length == 0) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_f0,"REJECTS_TABLE option cannot be empty",&local_119);
          BinderException::BinderException(pBVar8,&local_f0);
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar2 = KeywordHelper::RequiresQuotes(&format,true);
        if (bVar2) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_f0,
                     "rejects_scan option: %s requires quotes to be used as an identifier",
                     &local_119);
          ::std::__cxx11::string::string((string *)&local_50,(string *)&format);
          BinderException::BinderException<std::__cxx11::string>(pBVar8,&local_f0,&local_50);
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_b0,(string *)&format);
        CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Set(&this->rejects_table_name,&local_b0,true);
        this_00 = &local_b0;
      }
      else {
        bVar2 = ::std::operator==(loption,"rejects_scan");
        if (!bVar2) {
          bVar2 = ::std::operator==(loption,"rejects_limit");
          if (bVar2) {
            iVar5 = ParseInteger(value,loption);
            if (-1 < iVar5) {
              uVar4 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar5);
              this->rejects_limit = uVar4;
              return;
            }
            pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&format,
                       "Unsupported parameter for REJECTS_LIMIT: cannot be negative",
                       (allocator *)&local_f0);
            BinderException::BinderException(pBVar8,&format);
            __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar2 = ::std::operator==(loption,"encoding");
          if (!bVar2) {
            pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&format,"Unrecognized option for CSV reader \"%s\"",
                       (allocator *)&local_f0);
            ::std::__cxx11::string::string((string *)&local_90,(string *)loption);
            BinderException::BinderException<std::__cxx11::string>(pBVar8,&format,&local_90);
            __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          ParseString(&format,value,loption);
          ::std::__cxx11::string::operator=((string *)&this->encoding,(string *)&format);
          goto LAB_018cc713;
        }
        ParseString(&format,value,loption);
        if (format._M_string_length == 0) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_f0,"rejects_scan option cannot be empty",&local_119);
          BinderException::BinderException(pBVar8,&local_f0);
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar2 = KeywordHelper::RequiresQuotes(&format,true);
        if (bVar2) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_f0,
                     "rejects_scan option: %s requires quotes to be used as an identifier",
                     &local_119);
          ::std::__cxx11::string::string((string *)&local_70,(string *)&format);
          BinderException::BinderException<std::__cxx11::string>(pBVar8,&local_f0,&local_70);
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_d0,(string *)&format);
        CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Set(&this->rejects_scan_name,&local_d0,true);
        this_00 = &local_d0;
      }
      ::std::__cxx11::string::~string((string *)this_00);
    }
  }
LAB_018cc713:
  ::std::__cxx11::string::~string((string *)&format);
  return;
}

Assistant:

void CSVReaderOptions::SetReadOption(const string &loption, const Value &value, vector<string> &expected_names) {
	if (SetBaseOption(loption, value)) {
		return;
	}
	if (loption == "auto_detect") {
		auto_detect = ParseBoolean(value, loption);
	} else if (loption == "sample_size") {
		const auto sample_size_option = ParseInteger(value, loption);
		if (sample_size_option < 1 && sample_size_option != -1) {
			throw BinderException("Unsupported parameter for SAMPLE_SIZE: cannot be smaller than 1");
		}
		if (sample_size_option == -1) {
			// If -1, we basically read the whole thing
			sample_size_chunks = NumericLimits<idx_t>().Maximum();
		} else {
			sample_size_chunks = NumericCast<idx_t>(sample_size_option / STANDARD_VECTOR_SIZE);
			if (sample_size_option % STANDARD_VECTOR_SIZE != 0) {
				sample_size_chunks++;
			}
		}

	} else if (loption == "skip") {
		SetSkipRows(ParseInteger(value, loption));
	} else if (loption == "max_line_size" || loption == "maximum_line_size") {
		auto line_size = ParseInteger(value, loption);
		if (line_size < 0) {
			throw BinderException("Invalid value for MAX_LINE_SIZE parameter: it cannot be smaller than 0");
		}
		maximum_line_size.Set(NumericCast<idx_t>(line_size));
		if (buffer_size_option.IsSetByUser() && maximum_line_size.GetValue() > buffer_size_option.GetValue()) {
			throw InvalidInputException("Buffer Size of %d must be a higher value than the maximum line size %d",
			                            buffer_size_option.GetValue(), maximum_line_size.GetValue());
		}
	} else if (loption == "date_format" || loption == "dateformat") {
		string format = ParseString(value, loption);
		SetDateFormat(LogicalTypeId::DATE, format, true);
	} else if (loption == "timestamp_format" || loption == "timestampformat") {
		string format = ParseString(value, loption);
		SetDateFormat(LogicalTypeId::TIMESTAMP, format, true);
	} else if (loption == "ignore_errors") {
		ignore_errors.Set(ParseBoolean(value, loption));
	} else if (loption == "buffer_size") {
		buffer_size_option.Set(NumericCast<idx_t>(ParseInteger(value, loption)));
		if (buffer_size_option == 0) {
			throw InvalidInputException("Buffer Size option must be higher than 0");
		}
		if (maximum_line_size.IsSetByUser() && maximum_line_size.GetValue() > buffer_size_option.GetValue()) {
			throw InvalidInputException("Buffer Size of %d must be a higher value than the maximum line size %d",
			                            buffer_size_option.GetValue(), maximum_line_size.GetValue());
		} else {
			maximum_line_size.Set(buffer_size_option.GetValue(), false);
		}
	} else if (loption == "decimal_separator") {
		decimal_separator = ParseString(value, loption);
		if (decimal_separator != "." && decimal_separator != ",") {
			throw BinderException("Unsupported parameter for DECIMAL_SEPARATOR: should be '.' or ','");
		}
	} else if (loption == "null_padding") {
		null_padding = ParseBoolean(value, loption);
	} else if (loption == "parallel") {
		parallel = ParseBoolean(value, loption);
	} else if (loption == "allow_quoted_nulls") {
		allow_quoted_nulls = ParseBoolean(value, loption);
	} else if (loption == "store_rejects") {
		store_rejects.Set(ParseBoolean(value, loption));
	} else if (loption == "force_not_null") {
		if (!expected_names.empty()) {
			force_not_null = ParseColumnList(value, expected_names, loption);
		} else {
			if (value.IsNull()) {
				throw BinderException("Invalid value for 'force_not_null' paramenter");
			}
			// Get the list of columns to use as a recovery key
			auto &children = ListValue::GetChildren(value);
			for (auto &child : children) {
				auto col_name = child.GetValue<string>();
				force_not_null_names.insert(col_name);
			}
		}

	} else if (loption == "rejects_table") {
		// skip, handled in SetRejectsOptions
		auto table_name = ParseString(value, loption);
		if (table_name.empty()) {
			throw BinderException("REJECTS_TABLE option cannot be empty");
		}
		if (KeywordHelper::RequiresQuotes(table_name)) {
			throw BinderException("rejects_scan option: %s requires quotes to be used as an identifier", table_name);
		}
		rejects_table_name.Set(table_name);
	} else if (loption == "rejects_scan") {
		// skip, handled in SetRejectsOptions
		auto table_name = ParseString(value, loption);
		if (table_name.empty()) {
			throw BinderException("rejects_scan option cannot be empty");
		}
		if (KeywordHelper::RequiresQuotes(table_name)) {
			throw BinderException("rejects_scan option: %s requires quotes to be used as an identifier", table_name);
		}
		rejects_scan_name.Set(table_name);
	} else if (loption == "rejects_limit") {
		auto limit = ParseInteger(value, loption);
		if (limit < 0) {
			throw BinderException("Unsupported parameter for REJECTS_LIMIT: cannot be negative");
		}
		rejects_limit = NumericCast<idx_t>(limit);
	} else if (loption == "encoding") {
		encoding = ParseString(value, loption);
	} else {
		throw BinderException("Unrecognized option for CSV reader \"%s\"", loption);
	}
}